

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask15_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  uVar1 = in[2];
  uVar2 = in[3];
  *out = uVar1 << 0x1e | in[1] << 0xf | *in;
  uVar3 = in[4];
  uVar4 = in[5];
  out[1] = uVar3 << 0x1c | uVar2 << 0xd | uVar1 >> 2;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(in + 6);
  auVar5 = vpsllvd_avx2(auVar6,_DAT_0019d630);
  auVar6 = vpinsrd_avx(ZEXT416(uVar4 << 0xb | uVar3 >> 4),
                       (uint)(*(ulong *)(in + 6) >> 6) & 0x3ffffff,1);
  auVar6 = vpor_avx(auVar5,auVar6);
  *(long *)(out + 2) = auVar6._0_8_;
  return out + 4;
}

Assistant:

uint32_t *__fastpackwithoutmask15_8(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 15;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (15 - 13);
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (15 - 11);
  ++in;
  *out |= ((*in)) << 11;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (15 - 9);
  ++in;
  *out |= ((*in)) << 9;
  ++in;

  return out + 1;
}